

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.hpp
# Opt level: O3

void __thiscall
csv::internals::
StreamParser<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
::next(StreamParser<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *this,size_t bytes)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  size_t sVar3;
  element_type *peVar4;
  undefined8 *puVar5;
  char *pcVar6;
  ulong uVar7;
  RawCSVData *pRVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  RawCSVData *__tmp_1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  long lVar11;
  long lVar12;
  void *pvVar13;
  void *__tmp;
  size_t sVar14;
  ulong uVar15;
  undefined1 local_39;
  RawCSVData *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  
  if ((this->super_IBasicCSVParser)._eof != false) {
    return;
  }
  local_38 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<csv::internals::RawCSVData,std::allocator<csv::internals::RawCSVData>>
            (&_Stack_30,&local_38,(allocator<csv::internals::RawCSVData> *)&local_39);
  _Var9._M_pi = _Stack_30._M_pi;
  pRVar8 = local_38;
  local_38 = (RawCSVData *)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->super_IBasicCSVParser).data_ptr.
           super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->super_IBasicCSVParser).data_ptr.
  super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pRVar8;
  (this->super_IBasicCSVParser).data_ptr.
  super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var9._M_pi;
  if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1),
     _Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
  }
  memcpy(&((this->super_IBasicCSVParser).data_ptr.
           super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          parse_flags,&(this->super_IBasicCSVParser)._parse_flags,0x400);
  peVar2 = (this->super_IBasicCSVParser).data_ptr.
           super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (peVar2->col_names).super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (this->super_IBasicCSVParser)._col_names.
           super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(peVar2->col_names).
              super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(this->super_IBasicCSVParser)._col_names.
              super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  (this->super_IBasicCSVParser).fields =
       &((this->super_IBasicCSVParser).data_ptr.
         super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->fields;
  p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  p_Var10->_M_use_count = 1;
  p_Var10->_M_weak_count = 1;
  p_Var10->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00112c80;
  p_Var10[1]._vptr__Sp_counted_base = (_func_int **)(p_Var10 + 2);
  p_Var10[1]._M_use_count = 0;
  p_Var10[1]._M_weak_count = 0;
  *(undefined1 *)&p_Var10[2]._vptr__Sp_counted_base = 0;
  peVar2 = (this->super_IBasicCSVParser).data_ptr.
           super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (peVar2->_data).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = p_Var10 + 1;
  p_Var1 = (peVar2->_data).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (peVar2->_data).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var10;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  sVar14 = (this->super_IBasicCSVParser).source_size;
  if (sVar14 == 0) {
    lVar11 = std::istream::tellg();
    std::istream::seekg((long)&this->_source,_S_beg);
    lVar12 = std::istream::tellg();
    std::istream::seekg((long)&this->_source,_S_beg);
    sVar14 = lVar12 - lVar11;
    (this->super_IBasicCSVParser).source_size = sVar14;
  }
  sVar3 = this->stream_pos;
  uVar15 = sVar14 - sVar3;
  if (bytes <= uVar15) {
    uVar15 = bytes;
  }
  pvVar13 = operator_new__(uVar15);
  std::istream::seekg((long)&this->_source,(_Ios_Seekdir)sVar3);
  std::istream::read((char *)&this->_source,(long)pvVar13);
  sVar14 = std::istream::tellg();
  this->stream_pos = sVar14;
  peVar4 = (((this->super_IBasicCSVParser).data_ptr.
             super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           _data).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::_M_replace((ulong)peVar4,0,*(char **)((long)peVar4 + 8),(ulong)pvVar13);
  peVar2 = (this->super_IBasicCSVParser).data_ptr.
           super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  puVar5 = (undefined8 *)(peVar2->_data).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  pcVar6 = (char *)*puVar5;
  (peVar2->data)._M_len = puVar5[1];
  (peVar2->data)._M_str = pcVar6;
  peVar2 = (this->super_IBasicCSVParser).data_ptr.
           super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (this->super_IBasicCSVParser).data_ptr.
           super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        UNLOCK();
        goto LAB_00107f9b;
      }
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
  }
LAB_00107f9b:
  (this->super_IBasicCSVParser).current_row.data.
  super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  p_Var10 = (this->super_IBasicCSVParser).current_row.data.
            super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (this->super_IBasicCSVParser).current_row.data.
  super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var10);
  }
  (this->super_IBasicCSVParser).current_row.data_start = 0;
  (this->super_IBasicCSVParser).current_row.fields_start = 0;
  (this->super_IBasicCSVParser).current_row.row_length = 0;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  sVar14 = IBasicCSVParser::parse(&this->super_IBasicCSVParser);
  uVar7 = (this->super_IBasicCSVParser).source_size;
  if (this->stream_pos == uVar7 || uVar7 < 10000000) {
    (this->super_IBasicCSVParser)._eof = true;
    IBasicCSVParser::end_feed(&this->super_IBasicCSVParser);
  }
  else {
    this->stream_pos = (sVar14 - uVar15) + this->stream_pos;
  }
  operator_delete__(pvVar13);
  return;
}

Assistant:

void next(size_t bytes = ITERATION_CHUNK_SIZE) override {
                if (this->eof()) return;

                this->reset_data_ptr();
                this->data_ptr->_data = std::make_shared<std::string>();

                if (source_size == 0) {
                    const auto start = _source.tellg();
                    _source.seekg(0, std::ios::end);
                    const auto end = _source.tellg();
                    _source.seekg(0, std::ios::beg);

                    source_size = end - start;
                }

                // Read data into buffer
                size_t length = std::min(source_size - stream_pos, bytes);
                std::unique_ptr<char[]> buff(new char[length]);
                _source.seekg(stream_pos, std::ios::beg);
                _source.read(buff.get(), length);
                stream_pos = _source.tellg();
                ((std::string*)(this->data_ptr->_data.get()))->assign(buff.get(), length);

                // Create string_view
                this->data_ptr->data = *((std::string*)this->data_ptr->_data.get());

                // Parse
                this->current_row = CSVRow(this->data_ptr);
                size_t remainder = this->parse();

                if (stream_pos == source_size || no_chunk()) {
                    this->_eof = true;
                    this->end_feed();
                }
                else {
                    this->stream_pos -= (length - remainder);
                }
            }